

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_2d_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 local_8b38 [35592];
  
  if (-1 < h) {
    bVar6 = (byte)conv_params->round_0;
    bVar4 = (byte)conv_params->round_1;
    bVar5 = ('\x0e' - bVar6) - bVar4;
    uVar14 = (ulong)(uint)w;
    lVar3 = (long)w * 2;
    puVar12 = local_8b38;
    iVar10 = 0;
    do {
      if (0 < w) {
        uVar15 = 0;
        uVar1 = *src;
        do {
          uVar2 = src[uVar15 + 1];
          *(short *)(puVar12 + uVar15 * 2) =
               (short)((int)(((uint)uVar1 + (uint)uVar2) * 0x40 +
                            ((1 << (bVar6 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f))) >>
                      (bVar6 & 0x1f));
          uVar15 = uVar15 + 1;
          uVar1 = uVar2;
        } while (uVar14 != uVar15);
      }
      src = src + src_stride;
      puVar12 = puVar12 + lVar3;
      bVar16 = iVar10 != h;
      iVar10 = iVar10 + 1;
    } while (bVar16);
    if (h != 0) {
      bVar6 = ((char)bd - bVar6) + 0xe;
      bVar7 = bVar6 - bVar4;
      puVar13 = local_8b38 + uVar14 * 2;
      puVar12 = local_8b38;
      iVar10 = 0;
      do {
        if (0 < w) {
          uVar15 = 0;
          do {
            uVar11 = (((int)*(short *)(puVar13 + uVar15 * 2) + (int)*(short *)(puVar12 + uVar15 * 2)
                      ) * 0x40 + ((1 << (bVar4 & 0x1f)) >> 1) + (1 << (bVar6 & 0x1f)) >>
                     (bVar4 & 0x1f)) +
                     ((1 << (bVar5 & 0x1f)) >> 1) + (-1 << (bVar7 & 0x1f)) +
                     (-1 << (bVar7 - 1 & 0x1f)) >> (bVar5 & 0x1f);
            uVar9 = uVar11;
            if (bd == 10) {
              if (0x3fe < uVar11) {
                uVar9 = 0x3ff;
              }
            }
            else if (bd == 0xc) {
              if (0xffe < uVar11) {
                uVar9 = 0xfff;
              }
            }
            else if (0xfe < uVar11) {
              uVar9 = 0xff;
            }
            uVar8 = (uint16_t)uVar9;
            if ((int)uVar11 < 0) {
              uVar8 = 0;
            }
            dst[uVar15] = uVar8;
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        iVar10 = iVar10 + 1;
        puVar13 = puVar13 + lVar3;
        dst = dst + dst_stride;
        puVar12 = puVar12 + lVar3;
      } while (iVar10 != h);
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1)) + 64 * (src[x] + src[x + 1]);
      assert(0 <= sum && sum < (1 << (bd + FILTER_BITS + 1)));
      sum = ROUND_POWER_OF_TWO(sum, conv_params->round_0);
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << offset_bits) + 64 * (src_vert[x] + src_vert[im_stride + x]);
      assert(0 <= sum && sum < (1 << (offset_bits + 2)));
      const int32_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                          ((1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1)));

      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}